

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O3

void FuzzTest1(void)

{
  uint uVar1;
  uoffset_t uVar2;
  uint uVar3;
  long lVar4;
  int iVar5;
  FlatBufferBuilder builder;
  uoffset_t objects [10000];
  FlatBufferBuilder local_9cd8;
  uoffset_t auStack_9c78 [10002];
  
  flatbuffers::FlatBufferBuilder::FlatBufferBuilder(&local_9cd8,0x400);
  lcg_seed = 0xbc8f;
  lVar4 = 0;
  do {
    if (local_9cd8.offsetbuf_.
        super__Vector_base<flatbuffers::FlatBufferBuilder::FieldLoc,_std::allocator<flatbuffers::FlatBufferBuilder::FieldLoc>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        local_9cd8.offsetbuf_.
        super__Vector_base<flatbuffers::FlatBufferBuilder::FieldLoc,_std::allocator<flatbuffers::FlatBufferBuilder::FieldLoc>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      __assert_fail("!offsetbuf_.size()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/AlexStocks[P]flatbuffers/include/flatbuffers/flatbuffers.h"
                    ,0x183,"void flatbuffers::FlatBufferBuilder::NotNested()");
    }
    uVar2 = ((int)local_9cd8.buf_.reserved_ - (int)local_9cd8.buf_.cur_) + (int)local_9cd8.buf_.buf_
    ;
    iVar5 = -8;
    do {
      lcg_seed = (uint32_t)(((ulong)lcg_seed * 0x10a860c1) % 0xfffffffb);
      flatbuffers::FlatBufferBuilder::AddElement<float>(&local_9cd8,(short)iVar5 + 0xc,3.14159,0.0);
      iVar5 = iVar5 + 2;
    } while (iVar5 != 0);
    uVar2 = flatbuffers::FlatBufferBuilder::EndTable(&local_9cd8,uVar2,4);
    auStack_9c78[lVar4] = uVar2;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 10000);
  flatbuffers::FlatBufferBuilder::PreAlign(&local_9cd8,0,8);
  lcg_seed = 0xbc8f;
  uVar3 = ((int)local_9cd8.buf_.reserved_ - (int)local_9cd8.buf_.cur_) + (int)local_9cd8.buf_.buf_;
  lVar4 = 0;
  do {
    uVar1 = auStack_9c78[lVar4];
    iVar5 = 4;
    do {
      lcg_seed = (uint32_t)(((ulong)lcg_seed * 0x10a860c1) % 0xfffffffb);
      CompareTableFieldValue<float>
                ((Table *)(((ulong)uVar3 +
                           CONCAT44(local_9cd8.buf_.cur_._4_4_,(int)local_9cd8.buf_.cur_)) -
                          (ulong)uVar1),iVar5,3.14159);
      iVar5 = iVar5 + 2;
    } while (iVar5 != 0xc);
    lVar4 = lVar4 + 1;
  } while (lVar4 != 10000);
  if (local_9cd8.vtables_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_9cd8.vtables_.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_9cd8.offsetbuf_.
      super__Vector_base<flatbuffers::FlatBufferBuilder::FieldLoc,_std::allocator<flatbuffers::FlatBufferBuilder::FieldLoc>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_9cd8.offsetbuf_.
                    super__Vector_base<flatbuffers::FlatBufferBuilder::FieldLoc,_std::allocator<flatbuffers::FlatBufferBuilder::FieldLoc>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((void *)CONCAT44(local_9cd8.buf_.buf_._4_4_,(int)local_9cd8.buf_.buf_) != (void *)0x0) {
    operator_delete__((void *)CONCAT44(local_9cd8.buf_.buf_._4_4_,(int)local_9cd8.buf_.buf_));
  }
  return;
}

Assistant:

void FuzzTest1() {

  // Values we're testing against: chosen to ensure no bits get chopped
  // off anywhere, and also be different from eachother.
  const uint8_t  bool_val   = true;
  const int8_t   char_val   = -127;  // 0x81
  const uint8_t  uchar_val  = 0xFF;
  const int16_t  short_val  = -32222; // 0x8222;
  const uint16_t ushort_val = 0xFEEE;
  const int32_t  int_val    = 0x83333333;
  const uint32_t uint_val   = 0xFDDDDDDD;
  const int64_t  long_val   = 0x8444444444444444;
  const uint64_t ulong_val  = 0xFCCCCCCCCCCCCCCC;
  const float    float_val  = 3.14159f;
  const double   double_val = 3.14159265359;

  const int test_values_max = 11;
  const int fields_per_object = 4;
  const int num_fuzz_objects = 10000;  // The higher, the more thorough :)

  flatbuffers::FlatBufferBuilder builder;

  lcg_reset();  // Keep it deterministic.

  flatbuffers::uoffset_t objects[num_fuzz_objects];

  // Generate num_fuzz_objects random objects each consisting of
  // fields_per_object fields, each of a random type.
  for (int i = 0; i < num_fuzz_objects; i++) {
    auto start = builder.StartTable();
    for (int f = 0; f < fields_per_object; f++) {
      int choice = lcg_rand() % test_values_max;
      flatbuffers::voffset_t off = flatbuffers::FieldIndexToOffset(f);
      switch (choice) {
        case 0:  builder.AddElement<uint8_t >(off, bool_val,   0); break;
        case 1:  builder.AddElement<int8_t  >(off, char_val,   0); break;
        case 2:  builder.AddElement<uint8_t >(off, uchar_val,  0); break;
        case 3:  builder.AddElement<int16_t >(off, short_val,  0); break;
        case 4:  builder.AddElement<uint16_t>(off, ushort_val, 0); break;
        case 5:  builder.AddElement<int32_t >(off, int_val,    0); break;
        case 6:  builder.AddElement<uint32_t>(off, uint_val,   0); break;
        case 7:  builder.AddElement<int64_t >(off, long_val,   0); break;
        case 8:  builder.AddElement<uint64_t>(off, ulong_val,  0); break;
        case 9:  builder.AddElement<float   >(off, float_val,  0); break;
        case 10: builder.AddElement<double  >(off, double_val, 0); break;
      }
    }
    objects[i] = builder.EndTable(start, fields_per_object);
  }
  builder.PreAlign<flatbuffers::largest_scalar_t>(0);  // Align whole buffer.

  lcg_reset();  // Reset.

  uint8_t *eob = builder.GetBufferPointer() + builder.GetSize();

  // Test that all objects we generated are readable and return the
  // expected values. We generate random objects in the same order
  // so this is deterministic.
  for (int i = 0; i < num_fuzz_objects; i++) {
    auto table = reinterpret_cast<flatbuffers::Table *>(eob - objects[i]);
    for (int f = 0; f < fields_per_object; f++) {
      int choice = lcg_rand() % test_values_max;
      flatbuffers::voffset_t off = flatbuffers::FieldIndexToOffset(f);
      switch (choice) {
        case 0:  CompareTableFieldValue(table, off, bool_val  ); break;
        case 1:  CompareTableFieldValue(table, off, char_val  ); break;
        case 2:  CompareTableFieldValue(table, off, uchar_val ); break;
        case 3:  CompareTableFieldValue(table, off, short_val ); break;
        case 4:  CompareTableFieldValue(table, off, ushort_val); break;
        case 5:  CompareTableFieldValue(table, off, int_val   ); break;
        case 6:  CompareTableFieldValue(table, off, uint_val  ); break;
        case 7:  CompareTableFieldValue(table, off, long_val  ); break;
        case 8:  CompareTableFieldValue(table, off, ulong_val ); break;
        case 9:  CompareTableFieldValue(table, off, float_val ); break;
        case 10: CompareTableFieldValue(table, off, double_val); break;
      }
    }
  }
}